

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktxapp.h
# Opt level: O3

void __thiscall
ktxApp::processCommandLine
          (ktxApp *this,int argc,char **argv,StdinUse stdinStat,OutfilePos outfilePos)

{
  string *psVar1;
  char *pcVar2;
  char *pcVar3;
  pointer pbVar4;
  bool bVar5;
  long lVar6;
  ulong uVar7;
  value_type *__x;
  char cVar8;
  commandOptions *pcVar9;
  int iVar10;
  pointer pbVar11;
  argparser parser;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  argparser local_70;
  
  pcVar2 = *argv;
  psVar1 = &this->name;
  pcVar3 = (char *)(this->name)._M_string_length;
  strlen(pcVar2);
  std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar3,(ulong)pcVar2);
  cVar8 = (char)psVar1;
  lVar6 = std::__cxx11::string::rfind(cVar8,0x5c);
  if ((lVar6 != -1) || (lVar6 = std::__cxx11::string::rfind(cVar8,0x2f), lVar6 != -1)) {
    std::__cxx11::string::erase((ulong)psVar1,0);
  }
  uVar7 = std::__cxx11::string::rfind(cVar8,0x2e);
  if (uVar7 != 0xffffffffffffffff) {
    if ((this->name)._M_string_length < uVar7) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",
                 uVar7);
      goto LAB_001091bf;
    }
    (this->name)._M_string_length = uVar7;
    (this->name)._M_dataplus._M_p[uVar7] = '\0';
  }
  argparser::argparser(&local_70,argc,argv);
  (*this->_vptr_ktxApp[2])(this,&local_70);
  if (local_70.optind != argc) {
    if (outfilePos == eFirst) {
      std::__cxx11::string::_M_assign((string *)&this->options->outfile);
      local_70.optind = local_70.optind + 1;
    }
    if (local_70.optind < argc - (uint)(outfilePos == eLast)) {
      lVar6 = (ulong)local_70.optind << 5;
      iVar10 = (argc - (uint)(outfilePos == eLast)) - local_70.optind;
      do {
        pcVar2 = *(char **)((long)&((local_70.argv.
                                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                           lVar6);
        __x = (value_type *)
              ((long)&((local_70.argv.
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar6);
        if (*pcVar2 == '@') {
          bVar5 = loadFileList(this,__x,pcVar2[1] == '@',&this->options->infiles);
          if (!bVar5) goto LAB_0010919d;
        }
        else {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&this->options->infiles,__x);
        }
        lVar6 = lVar6 + 0x20;
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
    }
    pcVar9 = this->options;
    pbVar11 = (pcVar9->infiles).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar4 = (pcVar9->infiles).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (0x20 < (ulong)((long)pbVar4 - (long)pbVar11) && pbVar11 < pbVar4) {
      do {
        iVar10 = std::__cxx11::string::compare((char *)pbVar11);
        if (iVar10 == 0) {
          error(this,"cannot use stdin as one among many inputs.");
          (*this->_vptr_ktxApp[1])(this);
          goto LAB_0010919d;
        }
        pbVar11 = pbVar11 + 1;
        pcVar9 = this->options;
      } while (pbVar11 < (pcVar9->infiles).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    if (outfilePos == eLast) {
      std::__cxx11::string::_M_assign((string *)&pcVar9->outfile);
    }
  }
  pcVar9 = this->options;
  if ((pcVar9->infiles).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (pcVar9->infiles).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    if (stdinStat != eAllowStdin) {
LAB_001091bf:
      error(this,"need some input files.");
      (*this->_vptr_ktxApp[1])(this);
LAB_0010919d:
      exit(1);
    }
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"-","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pcVar9,&local_90
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  if ((outfilePos != eNone) && ((this->options->outfile)._M_string_length == 0)) {
    error(this,"need an output file");
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_70.argv.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.optarg._M_dataplus._M_p != &local_70.optarg.field_2) {
    operator_delete(local_70.optarg._M_dataplus._M_p,
                    local_70.optarg.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void processCommandLine(int argc, char* argv[],
                            StdinUse stdinStat = eAllowStdin,
                            OutfilePos outfilePos = eNone)
    {
        uint32_t i;
        size_t slash, dot;

        name = argv[0];
        // For consistent Id, only use the stem of name;
        slash = name.find_last_of('\\');
        if (slash == string::npos)
            slash = name.find_last_of('/');
        if (slash != string::npos)
            name.erase(0, slash+1);  // Remove directory name.
        dot = name.find_last_of('.');
            if (dot != string::npos)
                name.erase(dot, string::npos); // Remove extension.

        argparser parser(argc, argv);
        processOptions(parser);

        i = parser.optind;
        if (argc - i > 0) {
            if (outfilePos == eFirst)
                options.outfile = parser.argv[i++];
            uint32_t infileCount = outfilePos == eLast ? argc - 1 : argc;
            for (; i < infileCount; i++) {
                if (parser.argv[i][0] == '@') {
                    if (!loadFileList(parser.argv[i],
                                      parser.argv[i][1] == '@',
                                      options.infiles)) {
                        exit(1);
                    }
                } else {
                    options.infiles.push_back(parser.argv[i]);
                }
            }
            if (options.infiles.size() > 1) {
                std::vector<string>::const_iterator it;
                for (it = options.infiles.begin(); it < options.infiles.end(); it++) {
                    if (it->compare("-") == 0) {
                        error("cannot use stdin as one among many inputs.");
                        usage();
                        exit(1);
                    }
                }
            }
            if (outfilePos == eLast)
                options.outfile = parser.argv[i];
        }

        if (options.infiles.size() == 0) {
            if (stdinStat == eAllowStdin) {
                options.infiles.push_back("-"); // Use stdin as 0 files.
            } else {
                error("need some input files.");
                usage();
                exit(1);
            }
        }
        if (outfilePos != eNone && options.outfile.empty()) {
            error("need an output file");
        }
    }